

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_setkey(mbedtls_ccm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  mbedtls_cipher_info_t *cipher_info_00;
  mbedtls_cipher_info_t *cipher_info;
  int ret;
  uint keybits_local;
  uchar *key_local;
  mbedtls_cipher_id_t cipher_local;
  mbedtls_ccm_context *ctx_local;
  
  cipher_info_00 = mbedtls_cipher_info_from_values(cipher,keybits,MBEDTLS_MODE_ECB);
  if (cipher_info_00 == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0xd;
  }
  else if (cipher_info_00->block_size == 0x10) {
    mbedtls_cipher_free(&ctx->cipher_ctx);
    ctx_local._4_4_ = mbedtls_cipher_setup(&ctx->cipher_ctx,cipher_info_00);
    if ((ctx_local._4_4_ == 0) &&
       (ctx_local._4_4_ = mbedtls_cipher_setkey(&ctx->cipher_ctx,key,keybits,MBEDTLS_ENCRYPT),
       ctx_local._4_4_ == 0)) {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -0xd;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ccm_setkey( mbedtls_ccm_context *ctx,
                        mbedtls_cipher_id_t cipher,
                        const unsigned char *key,
                        unsigned int keybits )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_cipher_info_t *cipher_info;

    CCM_VALIDATE_RET( ctx != NULL );
    CCM_VALIDATE_RET( key != NULL );

    cipher_info = mbedtls_cipher_info_from_values( cipher, keybits,
                                                   MBEDTLS_MODE_ECB );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    if( cipher_info->block_size != 16 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    mbedtls_cipher_free( &ctx->cipher_ctx );

    if( ( ret = mbedtls_cipher_setup( &ctx->cipher_ctx, cipher_info ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_setkey( &ctx->cipher_ctx, key, keybits,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}